

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O0

int Curl_wait_ms(timediff_t timeout_ms)

{
  int *piVar1;
  undefined4 local_1c;
  timediff_t tStack_18;
  int r;
  timediff_t timeout_ms_local;
  
  if (timeout_ms == 0) {
    timeout_ms_local._4_4_ = 0;
  }
  else if (timeout_ms < 0) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    timeout_ms_local._4_4_ = -1;
  }
  else {
    tStack_18 = timeout_ms;
    if (0x7fffffff < timeout_ms) {
      tStack_18 = 0x7fffffff;
    }
    local_1c = poll((pollfd *)0x0,0,(int)tStack_18);
    if (local_1c != 0) {
      local_1c = -1;
    }
    timeout_ms_local._4_4_ = local_1c;
  }
  return timeout_ms_local._4_4_;
}

Assistant:

int Curl_wait_ms(timediff_t timeout_ms)
{
  int r = 0;

  if(!timeout_ms)
    return 0;
  if(timeout_ms < 0) {
    SET_SOCKERRNO(EINVAL);
    return -1;
  }
#if defined(MSDOS)
  delay(timeout_ms);
#elif defined(WIN32)
  /* prevent overflow, timeout_ms is typecast to ULONG/DWORD. */
#if TIMEDIFF_T_MAX >= ULONG_MAX
  if(timeout_ms >= ULONG_MAX)
    timeout_ms = ULONG_MAX-1;
    /* don't use ULONG_MAX, because that is equal to INFINITE */
#endif
  Sleep((ULONG)timeout_ms);
#else
#if defined(HAVE_POLL_FINE)
  /* prevent overflow, timeout_ms is typecast to int. */
#if TIMEDIFF_T_MAX > INT_MAX
  if(timeout_ms > INT_MAX)
    timeout_ms = INT_MAX;
#endif
  r = poll(NULL, 0, (int)timeout_ms);
#else
  {
    struct timeval pending_tv;
    r = select(0, NULL, NULL, NULL, curlx_mstotv(&pending_tv, timeout_ms));
  }
#endif /* HAVE_POLL_FINE */
#endif /* USE_WINSOCK */
  if(r)
    r = -1;
  return r;
}